

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_replaceRangeAString_success_biggerReplaceLength_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined8 uStack_90;
  AString replacement;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 6;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x13b89a;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012x67",7);
  replacement.buffer = (char *)0x0;
  replacement.reallocator._0_4_ = 0x11e238;
  replacement.reallocator._4_4_ = 0;
  replacement.deallocator._0_4_ = 0x11e278;
  replacement.deallocator._4_4_ = 0;
  replacement.size = 3;
  replacement.capacity = 3;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x13b8fc;
  replacement.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,4);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(replacement.buffer,"345",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x13b937;
  bVar1 = AString_replaceRangeAString(&string,3,1,&replacement);
  if (bVar1 == false) {
    uStack_90 = 0x13bace;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x6ac,
                      "Assertion \'AString_replaceRangeAString(&string, 3, 1, &replacement)\' failed"
                      ,0,0);
  }
  uStack_90 = 0x13b950;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x6ac);
  if (string.capacity != 8) {
    local_a0 = "(8)";
    pcVar8 = "(string).capacity == (8)";
    pcVar4 = "(string).capacity";
    pcVar5 = (char *)string.capacity;
LAB_0013bbb8:
    iVar2 = 0x6ad;
    local_98 = (char *)0x8;
LAB_0013bcc9:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_a0;
    goto LAB_0013bccb;
  }
  uStack_90 = 0x13b970;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x6ad);
  if (string.buffer == (char *)0x0) {
    ppcVar7 = &local_98;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar2 = 0x6ad;
    goto LAB_0013bd16;
  }
  uStack_90 = 0x13b98d;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x6ad);
  pcVar9 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar5 = "";
    pcVar9 = "(null)";
LAB_0013bb4c:
    local_a0 = "01234567";
    pcStack_b0 = "(\"01234567\")";
    pcVar8 = "(string).buffer == (\"01234567\")";
    pcVar4 = "(void*) (string).buffer";
    iVar2 = 0x6ad;
  }
  else {
    uStack_90 = 0x13b9aa;
    iVar2 = strcmp("01234567",string.buffer);
    if (iVar2 != 0) {
      pcVar5 = "\"";
      goto LAB_0013bb4c;
    }
    uStack_90 = 0x13b9c3;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x6ad);
    if (string.size != 8) {
      local_a0 = "strlen(\"01234567\")";
      pcVar8 = "(string).size == strlen(\"01234567\")";
      pcVar4 = "(string).size";
      pcVar5 = (char *)string.size;
      goto LAB_0013bbb8;
    }
    uStack_90 = 0x13b9e3;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x6ad);
    if (replacement.capacity != 3) {
      local_a0 = "(3)";
      pcVar8 = "(replacement).capacity == (3)";
      pcVar4 = "(replacement).capacity";
      pcVar5 = (char *)replacement.capacity;
LAB_0013bcbe:
      iVar2 = 0x6ae;
      local_98 = (char *)0x3;
      goto LAB_0013bcc9;
    }
    uStack_90 = 0x13ba03;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x6ae);
    if (replacement.buffer == (char *)0x0) {
      ppcVar7 = &local_98;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (replacement).buffer != NULL";
      pcVar9 = "(void*) (replacement).buffer";
      iVar2 = 0x6ae;
LAB_0013bd16:
      uStack_90 = 0;
      local_98 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) =
           test_AString_replaceRangeAString_success_biggerReplaceLength_bufferExpanded_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_90 = 0x13ba20;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x6ae);
    pcVar9 = replacement.buffer;
    if (replacement.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar5 = "";
    }
    else {
      uStack_90 = 0x13ba3d;
      iVar2 = strcmp("345",replacement.buffer);
      if (iVar2 == 0) {
        uStack_90 = 0x13ba56;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x6ae);
        if (replacement.size == 3) {
          uStack_90 = 0x13ba76;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x6ae);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_90 = 0x13ba97;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x6af);
            uStack_90 = 0x13baa0;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            uStack_90 = 0x13baa9;
            (*(code *)CONCAT44(replacement.deallocator._4_4_,replacement.deallocator._0_4_))
                      (replacement.buffer);
            return;
          }
          ppcVar7 = &local_a8;
          local_a0 = "(0)";
          local_a8 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x6af;
          goto LAB_0013bd16;
        }
        local_a0 = "strlen(\"345\")";
        pcVar8 = "(replacement).size == strlen(\"345\")";
        pcVar4 = "(replacement).size";
        pcVar5 = (char *)replacement.size;
        goto LAB_0013bcbe;
      }
      pcVar5 = "\"";
    }
    local_a0 = "345";
    pcStack_b0 = "(\"345\")";
    pcVar8 = "(replacement).buffer == (\"345\")";
    pcVar4 = "(void*) (replacement).buffer";
    iVar2 = 0x6ae;
  }
  pcVar4 = pcVar4 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_98 = "\"";
  local_a8 = "\"";
  ppcVar6 = &pcStack_c0;
  pcStack_c0 = pcVar9;
  pcStack_b8 = pcVar5;
LAB_0013bccb:
  uStack_90 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x13bcd2;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar8,pcVar4);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeAString_success_biggerReplaceLength)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012x67", 8);
    struct AString replacement = private_ACUtilsTest_AString_constructTestString("345", 3);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeAString(&string, 3, 1, &replacement));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234567", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(replacement, "345", 3);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
    private_ACUtilsTest_AString_destructTestString(replacement);
}